

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O1

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfUpdate(DiscreteExtendedKalmanFilterHelper *this)

{
  VectorDynSize *pVVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PointerType pdVar6;
  long lVar7;
  ulong uVar8;
  Index index_1;
  Index index;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  Index row;
  ulong uVar12;
  PointerType pdVar13;
  double *pdVar14;
  Index col;
  long lVar15;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> K;
  SrcEvaluatorType srcEvaluator;
  VectorDynSize z;
  assign_op<double,_double> local_1d9;
  MatrixDynSize *local_1d8;
  PointerType local_1d0;
  PointerType local_1c8;
  VectorDynSize *local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  PointerType local_1a0;
  PointerType local_198;
  undefined8 local_190;
  long local_188;
  undefined1 local_180 [16];
  ulong local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_148;
  Data local_128;
  VectorDynSize local_d8 [32];
  undefined1 local_b8 [32];
  variable_if_dynamic<long,__1> local_98;
  variable_if_dynamic<long,__1> vStack_90;
  variable_if_dynamic<long,__1> local_88;
  undefined1 local_80 [16];
  variable_if_dynamic<long,__1> local_70;
  variable_if_dynamic<long,__1> local_68;
  undefined8 local_60;
  PointerType local_58;
  variable_if_dynamic<long,__1> local_50;
  variable_if_dynamic<long,__1> local_48;
  
  if (this->m_is_initialized == false) {
    pcVar10 = "filter not initialized.";
  }
  else if (this->m_initial_state_set == false) {
    pcVar10 = "initial state not set.";
  }
  else if (this->m_initial_state_covariance_set == false) {
    pcVar10 = "initial state covariance not set.";
  }
  else {
    if (this->m_measurement_updated != false) {
      iDynTree::VectorDynSize::VectorDynSize(local_d8);
      iDynTree::VectorDynSize::resize((ulong)local_d8);
      pVVar1 = &this->m_xhat;
      (*this->_vptr_DiscreteExtendedKalmanFilterHelper[1])(this,pVVar1,local_d8);
      (*this->_vptr_DiscreteExtendedKalmanFilterHelper[4])(this,pVVar1,&this->m_H);
      local_1c0 = pVVar1;
      uVar3 = iDynTree::MatrixDynSize::data();
      lVar4 = iDynTree::MatrixDynSize::rows();
      local_150 = iDynTree::MatrixDynSize::cols();
      local_198 = (PointerType)iDynTree::MatrixDynSize::data();
      local_1a8 = iDynTree::MatrixDynSize::rows();
      local_1b0 = iDynTree::MatrixDynSize::cols();
      local_1d8 = &this->m_H;
      local_158 = lVar4;
      local_1a0 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar4 = iDynTree::MatrixDynSize::rows();
      lVar5 = iDynTree::MatrixDynSize::cols();
      local_1d0 = (PointerType)iDynTree::MatrixDynSize::data();
      pdVar6 = (PointerType)iDynTree::MatrixDynSize::rows();
      local_148.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_148.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_1d0;
      local_148.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)pdVar6;
      local_1d0 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar7 = iDynTree::MatrixDynSize::rows();
      local_1d8 = (MatrixDynSize *)iDynTree::MatrixDynSize::cols();
      local_1b8 = lVar7;
      local_1c8 = (PointerType)iDynTree::MatrixDynSize::data();
      local_160 = iDynTree::MatrixDynSize::rows();
      local_168 = iDynTree::MatrixDynSize::cols();
      uVar8 = iDynTree::VectorDynSize::data();
      local_170 = iDynTree::VectorDynSize::size();
      local_180._8_8_ = iDynTree::VectorDynSize::data();
      local_1c0 = (VectorDynSize *)iDynTree::VectorDynSize::size();
      local_180._0_8_ = iDynTree::VectorDynSize::data();
      pdVar6 = (PointerType)iDynTree::VectorDynSize::size();
      local_188 = iDynTree::VectorDynSize::data();
      local_190 = iDynTree::VectorDynSize::size();
      local_b8._0_8_ = local_1d0;
      local_b8._8_8_ = local_1b8;
      local_b8._16_8_ = local_1d8;
      local_98.m_value = (long)local_198;
      vStack_90.m_value = local_1a8;
      local_88.m_value = local_1b0;
      local_80._8_8_ = local_1d0;
      local_70.m_value = local_1b8;
      local_68.m_value = (long)local_1d8;
      local_58 = local_1c8;
      local_50.m_value = local_160;
      local_48.m_value = local_168;
      Eigen::internal::
      binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      ::Data::Data(&local_128,(XprType *)local_b8);
      if (0 < lVar4) {
        lVar7 = 0;
        pdVar13 = local_1a0;
        do {
          if (0 < lVar5) {
            lVar15 = 0;
            pdVar14 = local_128.lhsImpl.
                      super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                      .
                      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                      .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      .m_d.data;
            do {
              pdVar13[lVar15] =
                   *pdVar14 +
                   local_128.rhsImpl.
                   super_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   .
                   super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_data[lVar15];
              lVar15 = lVar15 + 1;
              pdVar14 = pdVar14 + local_128.lhsImpl.
                                  super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                                  .
                                  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                  .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  .m_d.m_outerStride;
            } while (lVar5 != lVar15);
          }
          lVar7 = lVar7 + 1;
          local_128.rhsImpl.
          super_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
          .
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
          .m_data = local_128.rhsImpl.
                    super_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    .
                    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    .m_data + local_128.rhsImpl.
                              super_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                              .
                              super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                              .m_outerStride.m_value;
          local_128.lhsImpl.
          super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
          .
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          data = local_128.lhsImpl.
                 super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                 .
                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 .m_d.data + 1;
          pdVar13 = pdVar13 + lVar5;
        } while (lVar7 != lVar4);
      }
      local_1c8 = pdVar6;
      free(local_128.lhsImpl.
           super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
           .
           super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      pdVar6 = local_198;
      local_b8._0_8_ = local_198;
      local_b8._8_8_ = local_1a8;
      local_b8._16_8_ = local_1b0;
      local_98.m_value = (long)local_1d0;
      vStack_90.m_value = local_1b8;
      local_88.m_value = (long)local_1d8;
      local_80._8_8_ = local_1a0;
      local_70.m_value = lVar4;
      local_68.m_value = lVar5;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::Inverse<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::internal::assign_op<double,double>>
                (&local_148,
                 (Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_Eigen::Inverse<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
                  *)local_b8,(assign_op<double,_double> *)&local_128,(type)0x0);
      local_b8._0_8_ = pdVar6;
      local_b8._8_8_ = local_1a8;
      local_b8._16_8_ = local_1b0;
      local_98.m_value =
           (long)local_148.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
      vStack_90.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_88.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_80._8_8_ = local_1d0;
      local_70.m_value = local_1b8;
      local_68.m_value = (long)local_1d8;
      local_58 = pdVar6;
      local_50.m_value = local_1a8;
      local_48.m_value = local_1b0;
      local_128._0_8_ = (double *)0x0;
      local_128.lhsImpl.
      super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
      .
      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
           (double *)0x0;
      local_128.lhsImpl.
      super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
      .
      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
      m_outerStride = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_128,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                  *)local_b8);
      pdVar6 = local_1c8;
      uVar12 = local_150 * local_158;
      uVar9 = uVar12;
      if (((uVar3 & 7) == 0) &&
         (uVar9 = (ulong)((uint)(uVar3 >> 3) & 1), (long)uVar12 <= (long)uVar9)) {
        uVar9 = uVar12;
      }
      lVar4 = uVar12 - uVar9;
      if (0 < (long)uVar9) {
        uVar11 = 0;
        do {
          *(double *)(uVar3 + uVar11 * 8) = *(double *)(local_128._0_8_ + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      lVar5 = (lVar4 - (lVar4 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
      if (1 < lVar4) {
        do {
          dVar2 = ((double *)(local_128._0_8_ + uVar9 * 8))[1];
          pdVar14 = (double *)(uVar3 + uVar9 * 8);
          *pdVar14 = *(double *)(local_128._0_8_ + uVar9 * 8);
          pdVar14[1] = dVar2;
          uVar9 = uVar9 + 2;
        } while ((long)uVar9 < lVar5);
      }
      if (lVar5 < (long)uVar12) {
        do {
          *(double *)(uVar3 + lVar5 * 8) = *(double *)(local_128._0_8_ + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (uVar12 - lVar5 != 0);
      }
      free((void *)local_128._0_8_);
      local_b8._0_8_ = local_180._8_8_;
      local_b8._8_8_ = local_1c0;
      local_b8._24_8_ =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
      local_98.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      vStack_90.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_80._0_8_ = local_180._0_8_;
      local_80._8_8_ = pdVar6;
      local_68.m_value = local_188;
      local_60 = local_190;
      local_128._0_8_ = (double *)0x0;
      local_128.lhsImpl.
      super_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
      .
      super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
           (double *)0x0;
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_128,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                  *)local_b8,&local_1d9);
      uVar3 = local_170;
      if (((uVar8 & 7) == 0) &&
         (uVar3 = (ulong)((uint)(uVar8 >> 3) & 1), (long)local_170 <= (long)uVar3)) {
        uVar3 = local_170;
      }
      lVar4 = local_170 - uVar3;
      if (0 < (long)uVar3) {
        uVar9 = 0;
        do {
          *(double *)(uVar8 + uVar9 * 8) = *(double *)(local_128._0_8_ + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      uVar9 = (lVar4 - (lVar4 >> 0x3f) & 0xfffffffffffffffeU) + uVar3;
      if (1 < lVar4) {
        do {
          dVar2 = ((double *)(local_128._0_8_ + uVar3 * 8))[1];
          pdVar14 = (double *)(uVar8 + uVar3 * 8);
          *pdVar14 = *(double *)(local_128._0_8_ + uVar3 * 8);
          pdVar14[1] = dVar2;
          uVar3 = uVar3 + 2;
        } while ((long)uVar3 < (long)uVar9);
      }
      if ((long)uVar9 < (long)local_170) {
        do {
          *(double *)(uVar8 + uVar9 * 8) = *(double *)(local_128._0_8_ + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (local_170 != uVar9);
      }
      free((void *)local_128._0_8_);
      this->m_measurement_updated = false;
      iDynTree::VectorDynSize::~VectorDynSize(local_d8);
      return true;
    }
    pcVar10 = "measurements not updated.";
  }
  iDynTree::reportError("DiscreteExtendedKalmanFilterHelper","ekfUpdate",pcVar10);
  return false;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfUpdate()
{
    if (!m_is_initialized)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "filter not initialized.");
        return false;
    }

    if (!m_initial_state_set)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "initial state not set.");
        return false;
    }

    if (!m_initial_state_covariance_set)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "initial state covariance not set.");
        return false;
    }

    if (!m_measurement_updated)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "measurements not updated.");
        return false;
    }

    iDynTree::VectorDynSize z;
    z.resize(m_dim_Y);
    ekf_h(m_xhat, z);                             ///< \f$ z_{k+1} = h(\hat{x}_{k+1}) \f$
    ekfComputeJacobianH(m_xhat, m_H);            ///< \f$ H \mid_{x = \hat{x}_{k+1}} \f$

    using iDynTree::toEigen;
    auto P(toEigen(m_P));
    auto Phat(toEigen(m_Phat));
    auto S(toEigen(m_S));
    auto K(toEigen(m_K));
    auto H(toEigen(m_H));
    auto R(toEigen(m_R));
    auto x(toEigen(m_x));
    auto xhat(toEigen(m_xhat));
    auto y(toEigen(m_y) - toEigen(z));        ///< innovation \f$ \tilde{y}_{k+1} = y_{k+1} - z_{k+1} \f$

    S = H*Phat*(H.transpose()) + R;             ///< \f$ S_{k+1} = H_{k+1} \hat{P}_{k+1} H_{k+1}^T + R \f$
    K = Phat*(H.transpose())*(S.inverse());       ///< \f$ K_{k+1} = \hat{P}_{k+1} H_{k+1}^T S_{k+1}^{-1} \f$
    P = Phat - (K*H*Phat);                    ///< \f$ P_{k+1} = \hat{P}_{k+1} - (K_{k+1} H \hat{P}_{k+1}) \f$
    x = xhat + K*y;                           ///< \f$ x_{k+1} = \hat{x}_{k+1} + K_{k+1} \tilde{y}_{k+1} \f$

    m_measurement_updated = false;
    return true;
}